

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void cf_aes_encrypt(cf_aes_context *ctx,uint8_t *in,uint8_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t round;
  uint uVar7;
  uint uVar8;
  uint32_t *puVar9;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_3c;
  uint8_t *local_38;
  
  local_3c = ctx->rounds;
  local_38 = out;
  if ((local_3c < 0xf) && ((0x5400U >> (local_3c & 0x1f) & 1) != 0)) {
    uVar1 = read32_be(in);
    uVar2 = read32_be(in + 4);
    uVar3 = read32_be(in + 8);
    uVar4 = read32_be(in + 0xc);
    local_58 = CONCAT44(uVar2,uVar1) ^ *(ulong *)ctx->ks;
    uStack_50 = CONCAT44(uVar4,uVar3) ^ *(ulong *)(ctx->ks + 2);
    puVar9 = ctx->ks;
    uVar7 = 1;
    while( true ) {
      puVar9 = puVar9 + 4;
      sub_block((uint32_t *)&local_58);
      shift_rows((uint32_t *)&local_58);
      if (local_3c <= uVar7) break;
      uVar1 = mix_column((uint32_t)local_58);
      uVar2 = mix_column(local_58._4_4_);
      uVar3 = mix_column((uint32_t)uStack_50);
      uVar4 = mix_column(uStack_50._4_4_);
      local_58 = CONCAT44(uVar2,uVar1) ^ *(ulong *)puVar9;
      uStack_50 = CONCAT44(uVar4,uVar3) ^ *(ulong *)(puVar9 + 2);
      uVar7 = uVar7 + 1;
    }
    uVar8 = (uint32_t)local_58 ^ *puVar9;
    uVar6 = local_58._4_4_ ^ puVar9[1];
    uVar5 = (uint32_t)uStack_50 ^ puVar9[2];
    uVar7 = uStack_50._4_4_ ^ puVar9[3];
    *local_38 = (uint8_t)(uVar8 >> 0x18);
    local_38[1] = (uint8_t)(uVar8 >> 0x10);
    local_38[2] = (uint8_t)(uVar8 >> 8);
    local_38[3] = (uint8_t)uVar8;
    local_38[4] = (uint8_t)(uVar6 >> 0x18);
    local_38[5] = (uint8_t)(uVar6 >> 0x10);
    local_38[6] = (uint8_t)(uVar6 >> 8);
    local_38[7] = (uint8_t)uVar6;
    local_38[8] = (uint8_t)(uVar5 >> 0x18);
    local_38[9] = (uint8_t)(uVar5 >> 0x10);
    local_38[10] = (uint8_t)(uVar5 >> 8);
    local_38[0xb] = (uint8_t)uVar5;
    local_38[0xc] = (uint8_t)(uVar7 >> 0x18);
    local_38[0xd] = (uint8_t)(uVar7 >> 0x10);
    local_38[0xe] = (uint8_t)(uVar7 >> 8);
    local_38[0xf] = (uint8_t)uVar7;
    return;
  }
  abort();
}

Assistant:

void cf_aes_encrypt(const cf_aes_context *ctx,
                    const uint8_t in[AES_BLOCKSZ],
                    uint8_t out[AES_BLOCKSZ])
{
  assert(ctx->rounds == AES128_ROUNDS ||
         ctx->rounds == AES192_ROUNDS ||
         ctx->rounds == AES256_ROUNDS);

  uint32_t state[4] = {
    read32_be(in + 0),
    read32_be(in + 4),
    read32_be(in + 8),
    read32_be(in + 12)
  };

  const uint32_t *round_keys = ctx->ks;
  add_round_key(state, round_keys);
  round_keys += 4;

  for (uint32_t round = 1; round < ctx->rounds; round++)
  {
    sub_block(state);
    shift_rows(state);
    mix_columns(state);
    add_round_key(state, round_keys);
    round_keys += 4;
  }

  sub_block(state);
  shift_rows(state);
  add_round_key(state, round_keys);

  write32_be(state[0], out + 0);
  write32_be(state[1], out + 4);
  write32_be(state[2], out + 8);
  write32_be(state[3], out + 12);
}